

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4ebe96::BNTest_RSAZABI_Test::TestBody(BNTest_RSAZABI_Test *this)

{
  Type_conflict args_3;
  uint32_t uVar1;
  int iVar2;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<BN_MONT_CTX> mont;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> n;
  BN_ULONG norm [16];
  BN_ULONG n_norm [16];
  BN_ULONG rsaz3 [40];
  BN_ULONG rsaz1 [40];
  BN_ULONG n_rsaz [40];
  BN_ULONG rsaz2 [40];
  BN_ULONG table [576];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18d0;
  AssertHelper local_18c8;
  internal local_18c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18b8;
  _Head_base<0UL,_bignum_st_*,_false> local_18b0;
  string local_18a8;
  AssertHelper local_1888;
  unsigned_long local_1880;
  undefined8 uStack_1878;
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  BN_ULONG local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  unsigned_long local_1780 [40];
  unsigned_long local_1640 [40];
  unsigned_long local_1500 [40];
  unsigned_long local_13c0 [40];
  unsigned_long local_1280 [586];
  
  uVar1 = OPENSSL_get_ia32cap(2);
  if ((uVar1 & 0x20) == 0) {
    return;
  }
  memset(local_1280,0,0x1200);
  local_1880 = 0x4242424242424242;
  uStack_1878 = 0x4242424242424242;
  local_1870 = 0x4242424242424242;
  uStack_1868 = 0x4242424242424242;
  local_1860 = 0x4242424242424242;
  uStack_1858 = 0x4242424242424242;
  local_1850 = 0x4242424242424242;
  uStack_1848 = 0x4242424242424242;
  local_1840 = 0x4242424242424242;
  uStack_1838 = 0x4242424242424242;
  local_1830 = 0x4242424242424242;
  uStack_1828 = 0x4242424242424242;
  local_1820 = 0x4242424242424242;
  uStack_1818 = 0x4242424242424242;
  local_1810 = 0x4242424242424242;
  uStack_1808 = 0x4242424242424242;
  local_1800 = 0x9999999999999999;
  uStack_17f8 = 0x9999999999999999;
  local_17f0 = 0x9999999999999999;
  uStack_17e8 = 0x9999999999999999;
  local_17e0 = 0x9999999999999999;
  uStack_17d8 = 0x9999999999999999;
  local_17d0 = 0x9999999999999999;
  uStack_17c8 = 0x9999999999999999;
  local_17c0 = 0x9999999999999999;
  uStack_17b8 = 0x9999999999999999;
  local_17b0 = 0x9999999999999999;
  uStack_17a8 = 0x9999999999999999;
  local_17a0 = 0x9999999999999999;
  uStack_1798 = 0x9999999999999999;
  local_1790 = 0x9999999999999999;
  uStack_1788 = 0x9999999999999999;
  local_18b0._M_head_impl = (bignum_st *)BN_new();
  local_18c0[0] = (internal)((BIGNUM *)local_18b0._M_head_impl != (BIGNUM *)0x0);
  local_18b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((BIGNUM *)local_18b0._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_18d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_18a8,local_18c0,(AssertionResult *)0x60ad42,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xb7d,local_18a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_18c8,(Message *)&local_18d0);
    testing::internal::AssertHelper::~AssertHelper(&local_18c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_18a8._M_dataplus._M_p != &local_18a8.field_2) {
      operator_delete(local_18a8._M_dataplus._M_p,local_18a8.field_2._M_allocated_capacity + 1);
    }
    if ((BN_MONT_CTX *)local_18d0._M_head_impl != (BN_MONT_CTX *)0x0) {
      (**(code **)(*(long *)local_18d0._M_head_impl + 8))();
    }
  }
  else {
    iVar2 = bn_set_words(local_18b0._M_head_impl,&local_1800,0x10);
    local_18c0[0] = (internal)(iVar2 != 0);
    local_18b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_18c0[0]) {
      local_18d0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           BN_MONT_CTX_new_for_modulus(local_18b0._M_head_impl,(BN_CTX *)0x0);
      local_18c0[0] = (internal)((BN_MONT_CTX *)local_18d0._M_head_impl != (BN_MONT_CTX *)0x0);
      local_18b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((BN_MONT_CTX *)local_18d0._M_head_impl == (BN_MONT_CTX *)0x0) {
        testing::Message::Message((Message *)&local_18c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_18a8,local_18c0,(AssertionResult *)0x5831e4,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1888,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb81,local_18a8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_1888,(Message *)&local_18c8);
        testing::internal::AssertHelper::~AssertHelper(&local_1888);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_18a8._M_dataplus._M_p != &local_18a8.field_2) {
          operator_delete(local_18a8._M_dataplus._M_p,local_18a8.field_2._M_allocated_capacity + 1);
        }
        if (local_18c8.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_18c8.data_ + 8))();
        }
        if (local_18b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_18b8,local_18b8);
        }
      }
      else {
        args_3 = ((BN_MONT_CTX *)local_18d0._M_head_impl)->n0[0];
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_norm2red_avx2, rsaz1, norm",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb84,true,rsaz_1024_norm2red_avx2,local_1640,&local_1880);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_norm2red_avx2, n_rsaz, n_norm",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb85,true,rsaz_1024_norm2red_avx2,local_1500,&local_1800);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                  ("rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb86,true,rsaz_1024_sqr_avx2,local_13c0,local_1640,local_1500,args_3,1);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long,int>
                  ("rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb87,true,rsaz_1024_sqr_avx2,local_1780,local_13c0,local_1500,args_3,4);
        abi_test::internal::
        CheckGTest<void,unsigned_long*,unsigned_long_const*,unsigned_long_const*,unsigned_long_const*,unsigned_long>
                  ("rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb88,true,rsaz_1024_mul_avx2,local_1780,local_1640,local_13c0,local_1500,args_3
                  );
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                  ("rsaz_1024_scatter5_avx2, table, rsaz3, 7",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb89,true,rsaz_1024_scatter5_avx2,local_1280,local_1780,7);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*,int>
                  ("rsaz_1024_gather5_avx2, rsaz1, table, 7",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb8a,true,rsaz_1024_gather5_avx2,local_1640,local_1280,7);
        abi_test::internal::CheckGTest<void,unsigned_long*,unsigned_long_const*>
                  ("rsaz_1024_red2norm_avx2, norm, rsaz1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0xb8b,true,rsaz_1024_red2norm_avx2,&local_1880,local_1640);
      }
      std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&local_18d0);
      goto LAB_002d383e;
    }
    testing::Message::Message((Message *)&local_18d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_18a8,local_18c0,(AssertionResult *)"bn_set_words(n.get(), n_norm, 16)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_18c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0xb7e,local_18a8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_18c8,(Message *)&local_18d0);
    testing::internal::AssertHelper::~AssertHelper(&local_18c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_18a8._M_dataplus._M_p != &local_18a8.field_2) {
      operator_delete(local_18a8._M_dataplus._M_p,local_18a8.field_2._M_allocated_capacity + 1);
    }
    if ((BN_MONT_CTX *)local_18d0._M_head_impl != (BN_MONT_CTX *)0x0) {
      (**(code **)(*(long *)local_18d0._M_head_impl + 8))();
    }
  }
  if (local_18b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18b8,local_18b8);
  }
LAB_002d383e:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18b0);
  return;
}

Assistant:

TEST_F(BNTest, RSAZABI) {
  if (!rsaz_avx2_capable()) {
    return;
  }

  alignas(64) BN_ULONG table[32 * 18] = {0};
  alignas(64) BN_ULONG rsaz1[40], rsaz2[40], rsaz3[40], n_rsaz[40];
  BN_ULONG norm[16], n_norm[16];

  OPENSSL_memset(norm, 0x42, sizeof(norm));
  OPENSSL_memset(n_norm, 0x99, sizeof(n_norm));

  bssl::UniquePtr<BIGNUM> n(BN_new());
  ASSERT_TRUE(n);
  ASSERT_TRUE(bn_set_words(n.get(), n_norm, 16));
  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(n.get(), nullptr));
  ASSERT_TRUE(mont);
  const BN_ULONG k = mont->n0[0];

  CHECK_ABI(rsaz_1024_norm2red_avx2, rsaz1, norm);
  CHECK_ABI(rsaz_1024_norm2red_avx2, n_rsaz, n_norm);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz2, rsaz1, n_rsaz, k, 1);
  CHECK_ABI(rsaz_1024_sqr_avx2, rsaz3, rsaz2, n_rsaz, k, 4);
  CHECK_ABI(rsaz_1024_mul_avx2, rsaz3, rsaz1, rsaz2, n_rsaz, k);
  CHECK_ABI(rsaz_1024_scatter5_avx2, table, rsaz3, 7);
  CHECK_ABI(rsaz_1024_gather5_avx2, rsaz1, table, 7);
  CHECK_ABI(rsaz_1024_red2norm_avx2, norm, rsaz1);
}